

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

pair<unsigned_long,_robin_hood::detail::Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::InsertionState>
 __thiscall
robin_hood::detail::
Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
::insertKeyPrepareEmptySpot<std::__cxx11::string_const&>
          (Table<false,80ul,std::__cxx11::string,robin_hood::detail::Table<true,80ul,char,double,robin_hood::hash<char,void>,std::equal_to<char>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  uint uVar1;
  InfoType IVar2;
  __type _Var3;
  bool bVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  size_t insertion_idx;
  ulong uVar8;
  pair<unsigned_long,_robin_hood::detail::Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::InsertionState>
  pVar9;
  InfoType info;
  size_t idx;
  int local_34;
  
  uVar8 = 0;
  uVar7 = 1;
  local_34 = 0;
  do {
    if (local_34 == 0x100) {
      insertion_idx = 0;
LAB_0010d982:
      pVar9._8_8_ = uVar8;
      pVar9.first = insertion_idx;
      return pVar9;
    }
    idx = 0;
    info = 0;
    keyToIdx<std::__cxx11::string_const&>(this,key,&idx,&info);
    Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::nextWhileLess((Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this,&info,&idx);
    for (; insertion_idx = idx, IVar2 = info, lVar5 = *(long *)(this + 0x20),
        info == *(byte *)(lVar5 + idx); info = info + *(int *)(this + 0x40)) {
      _Var3 = std::operator==(key,*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    **)(*(long *)(this + 0x18) + idx * 8));
      insertion_idx = idx;
      if (_Var3) goto LAB_0010d97f;
      idx = idx + 1;
    }
    if (*(ulong *)(this + 0x28) < *(ulong *)(this + 0x38)) {
      uVar7 = *(int *)(this + 0x40) + info;
      if (0xff < uVar7) {
        *(undefined8 *)(this + 0x38) = 0;
      }
      lVar6 = 0;
      for (; uVar1 = uVar7, *(char *)(lVar5 + idx) != '\0'; idx = idx + 1) {
        lVar6 = lVar6 + -1;
        uVar7 = uVar1 + *(int *)(this + 0x40);
        info = uVar1;
      }
      if (lVar6 != 0) {
        Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::shiftUp((Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this,idx,insertion_idx);
        lVar5 = *(long *)(this + 0x20);
      }
      *(char *)(lVar5 + insertion_idx) = (char)IVar2;
      *(long *)(this + 0x28) = *(long *)(this + 0x28) + 1;
      uVar7 = idx == insertion_idx ^ 3;
LAB_0010d97f:
      uVar8 = (ulong)uVar7;
      goto LAB_0010d982;
    }
    bVar4 = Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::increase_size((Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_robin_hood::detail::Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)this);
    if (!bVar4) {
      insertion_idx = 0;
      uVar7 = 0;
      goto LAB_0010d97f;
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

std::pair<size_t, InsertionState> insertKeyPrepareEmptySpot(OtherKey&& key) {
        for (int i = 0; i < 256; ++i) {
            size_t idx{};
            InfoType info{};
            keyToIdx(key, &idx, &info);
            nextWhileLess(&info, &idx);

            // while we potentially have a match
            while (info == mInfo[idx]) {
                if (WKeyEqual::operator()(key, mKeyVals[idx].getFirst())) {
                    // key already exists, do NOT insert.
                    // see http://en.cppreference.com/w/cpp/container/unordered_map/insert
                    return std::make_pair(idx, InsertionState::key_found);
                }
                next(&info, &idx);
            }

            // unlikely that this evaluates to true
            if (ROBIN_HOOD_UNLIKELY(mNumElements >= mMaxNumElementsAllowed)) {
                if (!increase_size()) {
                    return std::make_pair(size_t(0), InsertionState::overflow_error);
                }
                continue;
            }

            // key not found, so we are now exactly where we want to insert it.
            auto const insertion_idx = idx;
            auto const insertion_info = info;
            if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }

            // find an empty spot
            while (0 != mInfo[idx]) {
                next(&info, &idx);
            }

            if (idx != insertion_idx) {
                shiftUp(idx, insertion_idx);
            }
            // put at empty spot
            mInfo[insertion_idx] = static_cast<uint8_t>(insertion_info);
            ++mNumElements;
            return std::make_pair(insertion_idx, idx == insertion_idx
                                                     ? InsertionState::new_node
                                                     : InsertionState::overwrite_node);
        }

        // enough attempts failed, so finally give up.
        return std::make_pair(size_t(0), InsertionState::overflow_error);
    }